

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1load.c
# Opt level: O2

FT_Error parse_dict(T1_Face face,T1_Loader loader,FT_Byte *base,FT_ULong size)

{
  byte bVar1;
  byte bVar2;
  byte *pbVar3;
  int iVar4;
  ulong uVar5;
  size_t sVar6;
  FT_UInt FVar7;
  T1_Face *ppTVar8;
  byte *pbVar9;
  char *__s2;
  long lVar10;
  T1_Face pTVar11;
  T1_Face pTVar12;
  byte *pbVar13;
  T1_FieldRec *pTVar14;
  bool bVar15;
  size_t sStack_80;
  T1_Face local_70;
  T1_Face local_68;
  T1_Face local_60;
  byte *local_58;
  T1_Face local_50;
  T1_Face local_48;
  T1_Face local_40;
  FT_Byte *local_38;
  
  (loader->parser).root.cursor = base;
  pbVar9 = base + size;
  (loader->parser).root.limit = pbVar9;
  (loader->parser).root.error = 0;
  (*(loader->parser).root.funcs.skip_spaces)((PS_Parser)loader);
  pTVar11 = (T1_Face)&(face->type1).font_bbox;
  local_40 = (T1_Face)&(face->type1).private_dict;
  local_48 = (T1_Face)&(face->type1).font_extra;
  local_50 = (T1_Face)&face->type1;
  bVar2 = 0;
  local_58 = (byte *)0x0;
  while (pbVar13 = (loader->parser).root.cursor, pbVar13 < pbVar9) {
    bVar1 = *pbVar13;
    if (bVar1 == 0x46) {
      if (pbVar13 + 0xe != pbVar9) {
        if (pbVar13 + 0xe < pbVar9) {
          bVar1 = pbVar13[0xd];
          if ((((ulong)bVar1 < 0x3f) && ((0x5000832100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0))
             || ((bVar1 - 0x5b < 0x23 && ((0x500000005U >> ((ulong)(bVar1 - 0x5b) & 0x3f) & 1) != 0)
                 ))) goto LAB_00220b08;
        }
LAB_00220c90:
        (*(loader->parser).root.funcs.skip_PS_token)((PS_Parser)loader);
        if ((loader->parser).root.error == 0) goto LAB_00220ca2;
        break;
      }
LAB_00220b08:
      iVar4 = strncmp((char *)pbVar13,"FontDirectory",0xd);
      if (iVar4 != 0) goto LAB_00220c90;
      if ((loader->keywords_encountered & 1) != 0) {
        loader->keywords_encountered = loader->keywords_encountered | 2;
      }
      (loader->parser).root.cursor = pbVar13 + 0xd;
    }
    else {
      if (bVar1 == 99) {
        if (pbVar13 + 10 != pbVar9) {
          if (pbVar13 + 10 < pbVar9) {
            bVar2 = pbVar13[9];
            if ((((ulong)bVar2 < 0x3f) && ((0x5000832100003601U >> ((ulong)bVar2 & 0x3f) & 1) != 0))
               || ((bVar2 - 0x5b < 0x23 &&
                   ((0x500000005U >> ((ulong)(bVar2 - 0x5b) & 0x3f) & 1) != 0)))) goto LAB_00220a9d;
          }
          goto LAB_00220c90;
        }
LAB_00220a9d:
        __s2 = "closefile";
        sStack_80 = 9;
LAB_00220aa9:
        iVar4 = strncmp((char *)pbVar13,__s2,sStack_80);
        if (iVar4 != 0) goto LAB_00220c90;
        break;
      }
      if (bVar1 == 0x65) {
        if (pbVar13 + 6 != pbVar9) {
          if (pbVar13 + 6 < pbVar9) {
            bVar2 = pbVar13[5];
            if ((((ulong)bVar2 < 0x3f) && ((0x5000832100003601U >> ((ulong)bVar2 & 0x3f) & 1) != 0))
               || ((bVar2 - 0x5b < 0x23 &&
                   ((0x500000005U >> ((ulong)(bVar2 - 0x5b) & 0x3f) & 1) != 0)))) goto LAB_00220a43;
          }
          goto LAB_00220c90;
        }
LAB_00220a43:
        __s2 = "eexec";
        sStack_80 = 5;
        goto LAB_00220aa9;
      }
      if (bVar1 - 0x30 < 10) {
        (*(loader->parser).root.funcs.skip_PS_token)((PS_Parser)loader);
        bVar2 = 1;
        local_58 = pbVar13;
        if ((loader->parser).root.error == 0) goto LAB_00220ca5;
        break;
      }
      if (pbVar13 + 6 < pbVar9 && bVar1 == 0x52) {
        bVar15 = pbVar13[1] == 0x44;
LAB_00220ba6:
        if (!(bool)(bVar2 & bVar15)) goto LAB_00220c90;
        (loader->parser).root.cursor = local_58;
        iVar4 = read_binary_data(&loader->parser,(FT_ULong *)&local_70,&local_38,
                                 ((face->root).internal)->incremental_interface !=
                                 (FT_Incremental_InterfaceRec *)0x0);
        if (iVar4 == 0) {
          return 3;
        }
      }
      else {
        if (bVar1 == 0x2d && pbVar13 + 6 < pbVar9) {
          bVar15 = pbVar13[1] == 0x7c;
          goto LAB_00220ba6;
        }
        if (pbVar9 <= pbVar13 + 2 || bVar1 != 0x2f) goto LAB_00220c90;
        pbVar13 = pbVar13 + 1;
        (loader->parser).root.cursor = pbVar13;
        (*(loader->parser).root.funcs.skip_PS_token)((PS_Parser)loader);
        if ((loader->parser).root.error != 0) break;
        pbVar3 = (loader->parser).root.cursor;
        uVar5 = (long)pbVar3 - (long)pbVar13;
        if (pbVar3 < pbVar9 && (int)uVar5 - 1U < 0x15) {
          uVar5 = uVar5 & 0xffffffff;
          pTVar14 = t1_keywords;
          local_68 = pTVar11;
          local_60 = face;
LAB_00220c59:
          pbVar3 = (byte *)pTVar14->ident;
          if (pbVar3 != (byte *)0x0) {
            if (((*pbVar13 != *pbVar3) || (sVar6 = strlen((char *)pbVar3), uVar5 != sVar6)) ||
               (iVar4 = bcmp(pbVar13,pbVar3,uVar5), iVar4 != 0)) goto LAB_00220c8a;
            if (((pTVar14->dict & (loader->keywords_encountered & 1) + 1) == 0) ||
               (((loader->keywords_encountered & 2) != 0 &&
                (iVar4 = strcmp((char *)pbVar3,"CharStrings"), iVar4 != 0)))) goto LAB_00220ce4;
            face = local_60;
            pTVar11 = (T1_Face)local_60->blend;
            if (pTVar11 == (T1_Face)0x0) {
              pTVar12 = (T1_Face)0x0;
            }
            else {
              pTVar12 = (T1_Face)0x0;
              if (*(int *)&((PS_ParserRec *)&(pTVar11->root).num_faces)->cursor != 0) {
                pTVar12 = pTVar11;
              }
            }
            if (pTVar14->type == T1_FIELD_TYPE_CALLBACK) {
              (*pTVar14->reader)(&local_60->root,loader);
              iVar4 = (loader->parser).root.error;
              goto LAB_00220de0;
            }
            local_70 = local_50;
            switch(pTVar14->location) {
            case T1_FIELD_LOCATION_FONT_EXTRA:
              local_70 = local_48;
              break;
            case T1_FIELD_LOCATION_FONT_INFO:
              lVar10 = 0x118;
              goto LAB_00220d8f;
            case T1_FIELD_LOCATION_PRIVATE:
              local_70 = local_40;
              lVar10 = 0x1a0;
              goto LAB_00220d8f;
            case T1_FIELD_LOCATION_BBOX:
              local_70 = local_68;
              lVar10 = 0x230;
LAB_00220d8f:
              if (pTVar12 == (T1_Face)0x0) break;
              ppTVar8 = (T1_Face *)
                        ((long)&((PS_ParserRec *)&(pTVar12->root).num_faces)->cursor + lVar10);
              FVar7 = *(FT_UInt *)&((PS_ParserRec *)&(pTVar12->root).num_faces)->cursor;
              pTVar11 = *(T1_Face *)
                         ((long)&((PS_ParserRec *)&(pTVar12->root).num_faces)->cursor + lVar10);
LAB_00220dba:
              if (pTVar11 != (T1_Face)0x0) goto LAB_00220dbf;
              (loader->parser).root.error = 0;
              goto LAB_00220ce4;
            case T1_FIELD_LOCATION_LOADER:
              local_70 = (T1_Face)loader;
              break;
            case T1_FIELD_LOCATION_FACE:
              local_70 = local_60;
              break;
            case T1_FIELD_LOCATION_BLEND:
              FVar7 = 0;
              ppTVar8 = &local_70;
              local_70 = pTVar11;
              goto LAB_00220dba;
            }
            FVar7 = 0;
            ppTVar8 = &local_70;
LAB_00220dbf:
            if (pTVar14->type - T1_FIELD_TYPE_INTEGER_ARRAY < 2) {
              iVar4 = (*(loader->parser).root.funcs.load_field_table)
                                ((PS_Parser)loader,pTVar14,ppTVar8,FVar7,(FT_ULong *)0x0);
            }
            else {
              iVar4 = (*(loader->parser).root.funcs.load_field)
                                ((PS_Parser)loader,pTVar14,ppTVar8,FVar7,(FT_ULong *)0x0);
            }
LAB_00220de0:
            (loader->parser).root.error = iVar4;
            pTVar11 = local_68;
            if (iVar4 != 0) {
              if ((char)iVar4 != -0x5e) {
                return iVar4;
              }
              (loader->parser).root.error = 0;
            }
            goto LAB_00220ca2;
          }
LAB_00220ce4:
          bVar2 = 0;
          face = local_60;
          pTVar11 = local_68;
          goto LAB_00220ca5;
        }
      }
LAB_00220ca2:
      bVar2 = 0;
    }
LAB_00220ca5:
    (*(loader->parser).root.funcs.skip_spaces)((PS_Parser)loader);
  }
  return (loader->parser).root.error;
LAB_00220c8a:
  pTVar14 = pTVar14 + 1;
  goto LAB_00220c59;
}

Assistant:

static FT_Error
  parse_dict( T1_Face    face,
              T1_Loader  loader,
              FT_Byte*   base,
              FT_ULong   size )
  {
    T1_Parser  parser = &loader->parser;
    FT_Byte   *limit, *start_binary = NULL;
    FT_Bool    have_integer = 0;


    parser->root.cursor = base;
    parser->root.limit  = base + size;
    parser->root.error  = FT_Err_Ok;

    limit = parser->root.limit;

    T1_Skip_Spaces( parser );

    while ( parser->root.cursor < limit )
    {
      FT_Byte*  cur;


      cur = parser->root.cursor;

      /* look for `eexec' */
      if ( IS_PS_TOKEN( cur, limit, "eexec" ) )
        break;

      /* look for `closefile' which ends the eexec section */
      else if ( IS_PS_TOKEN( cur, limit, "closefile" ) )
        break;

      /* in a synthetic font the base font starts after a           */
      /* `FontDictionary' token that is placed after a Private dict */
      else if ( IS_PS_TOKEN( cur, limit, "FontDirectory" ) )
      {
        if ( loader->keywords_encountered & T1_PRIVATE )
          loader->keywords_encountered |=
            T1_FONTDIR_AFTER_PRIVATE;
        parser->root.cursor += 13;
      }

      /* check whether we have an integer */
      else if ( ft_isdigit( *cur ) )
      {
        start_binary = cur;
        T1_Skip_PS_Token( parser );
        if ( parser->root.error )
          goto Exit;
        have_integer = 1;
      }

      /* in valid Type 1 fonts we don't see `RD' or `-|' directly */
      /* since those tokens are handled by parse_subrs and        */
      /* parse_charstrings                                        */
      else if ( *cur == 'R' && cur + 6 < limit && *( cur + 1 ) == 'D' &&
                have_integer                                          )
      {
        FT_ULong  s;
        FT_Byte*  b;


        parser->root.cursor = start_binary;
        if ( !read_binary_data( parser, &s, &b, IS_INCREMENTAL ) )
          return FT_THROW( Invalid_File_Format );
        have_integer = 0;
      }

      else if ( *cur == '-' && cur + 6 < limit && *( cur + 1 ) == '|' &&
                have_integer                                          )
      {
        FT_ULong  s;
        FT_Byte*  b;


        parser->root.cursor = start_binary;
        if ( !read_binary_data( parser, &s, &b, IS_INCREMENTAL ) )
          return FT_THROW( Invalid_File_Format );
        have_integer = 0;
      }

      /* look for immediates */
      else if ( *cur == '/' && cur + 2 < limit )
      {
        FT_UInt  len;


        cur++;

        parser->root.cursor = cur;
        T1_Skip_PS_Token( parser );
        if ( parser->root.error )
          goto Exit;

        len = (FT_UInt)( parser->root.cursor - cur );

        if ( len > 0 && len < 22 && parser->root.cursor < limit )
        {
          /* now compare the immediate name to the keyword table */
          T1_Field  keyword = (T1_Field)t1_keywords;


          for (;;)
          {
            FT_Byte*  name;


            name = (FT_Byte*)keyword->ident;
            if ( !name )
              break;

            if ( cur[0] == name[0]                      &&
                 len == ft_strlen( (const char *)name ) &&
                 ft_memcmp( cur, name, len ) == 0       )
            {
              /* We found it -- run the parsing callback!     */
              /* We record every instance of every field      */
              /* (until we reach the base font of a           */
              /* synthetic font) to deal adequately with      */
              /* multiple master fonts; this is also          */
              /* necessary because later PostScript           */
              /* definitions override earlier ones.           */

              /* Once we encounter `FontDirectory' after      */
              /* `/Private', we know that this is a synthetic */
              /* font; except for `/CharStrings' we are not   */
              /* interested in anything that follows this     */
              /* `FontDirectory'.                             */

              /* MM fonts have more than one /Private token at */
              /* the top level; let's hope that all the junk   */
              /* that follows the first /Private token is not  */
              /* interesting to us.                            */

              /* According to Adobe Tech Note #5175 (CID-Keyed */
              /* Font Installation for ATM Software) a `begin' */
              /* must be followed by exactly one `end', and    */
              /* `begin' -- `end' pairs must be accurately     */
              /* paired.  We could use this to distinguish     */
              /* between the global Private and the Private    */
              /* dict that is a member of the Blend dict.      */

              const FT_UInt dict =
                ( loader->keywords_encountered & T1_PRIVATE )
                    ? T1_FIELD_DICT_PRIVATE
                    : T1_FIELD_DICT_FONTDICT;


              if ( !( dict & keyword->dict ) )
              {
                FT_TRACE1(( "parse_dict: found `%s' but ignoring it"
                            " since it is in the wrong dictionary\n",
                            keyword->ident ));
                break;
              }

              if ( !( loader->keywords_encountered &
                      T1_FONTDIR_AFTER_PRIVATE     )                  ||
                   ft_strcmp( (const char*)name, "CharStrings" ) == 0 )
              {
                parser->root.error = t1_load_keyword( face,
                                                      loader,
                                                      keyword );
                if ( parser->root.error )
                {
                  if ( FT_ERR_EQ( parser->root.error, Ignore ) )
                    parser->root.error = FT_Err_Ok;
                  else
                    return parser->root.error;
                }
              }
              break;
            }

            keyword++;
          }
        }

        have_integer = 0;
      }
      else
      {
        T1_Skip_PS_Token( parser );
        if ( parser->root.error )
          goto Exit;
        have_integer = 0;
      }

      T1_Skip_Spaces( parser );
    }

  Exit:
    return parser->root.error;
  }